

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureViewTestBaseAndMaxLevels::initProgram(TextureViewTestBaseAndMaxLevels *this)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  GLint GVar4;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar6;
  GLint compile_status;
  GLuint so_ids [2];
  GLint link_status;
  ostringstream local_1a8 [376];
  long lVar5;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  GVar2 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar2;
  GVar2 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar2;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCreateShader() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x24e1);
  GVar2 = (**(code **)(lVar5 + 0x3c8))();
  this->m_po_id = GVar2;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCreateProgram() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x24e6);
  (**(code **)(lVar5 + 0x12b8))(this->m_vs_id,1,&initProgram::vs_body,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glShaderSource() call failed for vertex shader case",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x24fa);
  (**(code **)(lVar5 + 0x12b8))(this->m_fs_id,1,&initProgram::fs_body,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glShaderSource() call failed for fragment shader case",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x250c);
  so_ids[0] = this->m_fs_id;
  so_ids[1] = this->m_vs_id;
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    GVar2 = so_ids[lVar6];
    (**(code **)(lVar5 + 0x248))(GVar2);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2517);
    compile_status = 0;
    (**(code **)(lVar5 + 0xa70))(GVar2,0x8b81,&compile_status);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x251d);
    if (compile_status != 1) {
      _link_status = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,"Shader compilation failed");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&link_status,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
    }
  }
  (**(code **)(lVar5 + 0x10))(this->m_po_id,this->m_fs_id);
  (**(code **)(lVar5 + 0x10))(this->m_po_id,this->m_vs_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glAttachShader() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2528);
  (**(code **)(lVar5 + 0xce8))(this->m_po_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glLinkProgram() call faikled",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x252c);
  _link_status = (TestLog *)((ulong)_link_status & 0xffffffff00000000);
  (**(code **)(lVar5 + 0x9d8))(this->m_po_id,0x8b82,&link_status);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGetProgramiv() failed for GL_LINK_STATUS pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2532);
  if (link_status == 1) {
    GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"lod_index");
    this->m_po_lod_index_uniform_location = GVar4;
    iVar1 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"to_sampler");
    this->m_po_to_sampler_uniform_location = iVar1;
    if (this->m_po_lod_index_uniform_location == -1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"lod_index is considered an inactive uniform",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x253f);
    }
    else {
      if (iVar1 != -1) {
        return;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"to_sampler is considered an inactive uniform",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x2544);
    }
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Program linking failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x2536);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureViewTestBaseAndMaxLevels::initProgram()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate shader object IDs */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed");

	/* Generate program object ID */
	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed");

	/* Set up vertex shader body */
	static const char* vs_body =
		"#version 400\n"
		"\n"
		"out vec2 uv;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    switch (gl_VertexID)\n"
		"    {\n"
		"        case 0: gl_Position = vec4(-1.0,  1.0, 0.0, 1.0); uv = vec2(0.0, 1.0); break;\n"
		"        case 1: gl_Position = vec4(-1.0, -1.0, 0.0, 1.0); uv = vec2(0.0, 0.0); break;\n"
		"        case 2: gl_Position = vec4( 1.0,  1.0, 0.0, 1.0); uv = vec2(1.0, 1.0); break;\n"
		"        case 3: gl_Position = vec4( 1.0, -1.0, 0.0, 1.0); uv = vec2(1.0, 0.0); break;\n"
		"    };\n"
		"}\n";

	gl.shaderSource(m_vs_id, 1 /* count */, &vs_body, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed for vertex shader case");

	/* Set up fragment shader body */
	static const char* fs_body = "#version 400\n"
								 "\n"
								 "in vec2 uv;\n"
								 "\n"
								 "uniform int       lod_index;\n"
								 "uniform sampler2D to_sampler;\n"
								 "\n"
								 "out vec4 result;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    result = textureLod(to_sampler, uv, float(lod_index) );\n"
								 "}\n";

	gl.shaderSource(m_fs_id, 1 /* count */, &fs_body, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed for fragment shader case");

	/* Compile both shaders */
	const glw::GLuint  so_ids[] = { m_fs_id, m_vs_id };
	const unsigned int n_so_ids = sizeof(so_ids) / sizeof(so_ids[0]);

	for (unsigned int n_so_id = 0; n_so_id < n_so_ids; ++n_so_id)
	{
		glw::GLint so_id = so_ids[n_so_id];

		gl.compileShader(so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		/* Make sure the compilation has succeeded */
		glw::GLint compile_status = GL_FALSE;

		gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		if (compile_status != GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Shader compilation failed" << tcu::TestLog::EndMessage;
		}
	} /* for (all shader objects) */

	/* Attach the shaders to the program object */
	gl.attachShader(m_po_id, m_fs_id);
	gl.attachShader(m_po_id, m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed");

	/* Link the program object */
	gl.linkProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call faikled");

	/* Verify the linking has succeeded */
	glw::GLint link_status = GL_FALSE;

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed for GL_LINK_STATUS pname");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed");
	}

	/* Retrieve uniform locations */
	m_po_lod_index_uniform_location  = gl.getUniformLocation(m_po_id, "lod_index");
	m_po_to_sampler_uniform_location = gl.getUniformLocation(m_po_id, "to_sampler");

	if (m_po_lod_index_uniform_location == -1)
	{
		TCU_FAIL("lod_index is considered an inactive uniform");
	}

	if (m_po_to_sampler_uniform_location == -1)
	{
		TCU_FAIL("to_sampler is considered an inactive uniform");
	}
}